

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaptexture.cpp
# Opt level: O0

void __thiscall FAutomapTexture::MakeTexture(FAutomapTexture *this)

{
  void *pvVar1;
  BYTE *pBVar2;
  BYTE *indata;
  FMemLump data;
  int y;
  int x;
  FAutomapTexture *this_local;
  
  FWadCollection::ReadLump((FWadCollection *)&indata,0xdb0460);
  pvVar1 = FMemLump::GetMem((FMemLump *)&indata);
  pBVar2 = (BYTE *)operator_new__((long)(int)((uint)(this->super_FTexture).Width *
                                             (uint)(this->super_FTexture).Height));
  this->Pixels = pBVar2;
  for (data.Block.Chars._4_4_ = 0; data.Block.Chars._4_4_ < (int)(uint)(this->super_FTexture).Width;
      data.Block.Chars._4_4_ = data.Block.Chars._4_4_ + 1) {
    for (data.Block.Chars._0_4_ = 0;
        (int)data.Block.Chars < (int)(uint)(this->super_FTexture).Height;
        data.Block.Chars._0_4_ = (int)data.Block.Chars + 1) {
      this->Pixels
      [(int)(data.Block.Chars._4_4_ * (uint)(this->super_FTexture).Height + (int)data.Block.Chars)]
           = *(BYTE *)((long)pvVar1 + (long)(data.Block.Chars._4_4_ + (int)data.Block.Chars * 0x140)
                      );
    }
  }
  FMemLump::~FMemLump((FMemLump *)&indata);
  return;
}

Assistant:

void FAutomapTexture::MakeTexture ()
{
	int x, y;
	FMemLump data = Wads.ReadLump (SourceLump);
	const BYTE *indata = (const BYTE *)data.GetMem();

	Pixels = new BYTE[Width * Height];

	for (x = 0; x < Width; ++x)
	{
		for (y = 0; y < Height; ++y)
		{
			Pixels[x*Height+y] = indata[x+320*y];
		}
	}
}